

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void ctemplate::EmitMissingInclude
               (char *filename,ExpandEmitter *output_buffer,PerExpandData *per_expand_data)

{
  PerExpandData *pPVar1;
  ExpandEmitter *pEVar2;
  bool bVar3;
  TemplateAnnotator *pTVar4;
  ostream *poVar5;
  allocator local_49;
  string local_48 [32];
  TemplateAnnotator *local_28;
  TemplateAnnotator *annotator;
  PerExpandData *per_expand_data_local;
  ExpandEmitter *output_buffer_local;
  char *filename_local;
  
  annotator = (TemplateAnnotator *)per_expand_data;
  per_expand_data_local = (PerExpandData *)output_buffer;
  output_buffer_local = (ExpandEmitter *)filename;
  bVar3 = PerExpandData::annotate(per_expand_data);
  if (bVar3) {
    pTVar4 = PerExpandData::annotator((PerExpandData *)annotator);
    pEVar2 = output_buffer_local;
    pPVar1 = per_expand_data_local;
    local_28 = pTVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,(char *)pEVar2,&local_49);
    (*pTVar4->_vptr_TemplateAnnotator[10])(pTVar4,pPVar1,local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
  poVar5 = std::operator<<(poVar5,"Failed to load included template: \"");
  poVar5 = std::operator<<(poVar5,(char *)output_buffer_local);
  std::operator<<(poVar5,"\"\n");
  return;
}

Assistant:

static void EmitMissingInclude(const char* const filename,
                               ExpandEmitter *output_buffer,
                               PerExpandData *per_expand_data) {
  // if there was a problem retrieving the template, bail!
  if (per_expand_data->annotate()) {
    TemplateAnnotator* annotator = per_expand_data->annotator();
    annotator->EmitFileIsMissing(output_buffer, filename);
  }
  LOG(ERROR) << "Failed to load included template: \"" << filename << "\"\n";
}